

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall
ON_3dmAnnotationSettingsPrivate::operator==
          (ON_3dmAnnotationSettingsPrivate *this,ON_3dmAnnotationSettingsPrivate *other)

{
  int iVar1;
  ON_3dmAnnotationSettingsPrivate *other_local;
  ON_3dmAnnotationSettingsPrivate *this_local;
  
  if (this == other) {
    this_local._7_1_ = true;
  }
  else if ((this->m_world_view_text_scale != other->m_world_view_text_scale) ||
          (NAN(this->m_world_view_text_scale) || NAN(other->m_world_view_text_scale))) {
    this_local._7_1_ = false;
  }
  else if ((this->m_world_view_hatch_scale != other->m_world_view_hatch_scale) ||
          (NAN(this->m_world_view_hatch_scale) || NAN(other->m_world_view_hatch_scale))) {
    this_local._7_1_ = false;
  }
  else if ((this->m_use_dimension_layer & 1U) == (other->m_use_dimension_layer & 1U)) {
    iVar1 = ON_UuidCompare(&this->m_dimension_layer_id,&other->m_dimension_layer_id);
    if (iVar1 == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmAnnotationSettingsPrivate::operator==(const ON_3dmAnnotationSettingsPrivate& other) const
{
  if (this == &other)
    return true;

  if (m_world_view_text_scale != other.m_world_view_text_scale)
    return false;

  if (m_world_view_hatch_scale != other.m_world_view_hatch_scale)
    return false;

  if (m_use_dimension_layer != other.m_use_dimension_layer)
    return false;

  if (0 != ON_UuidCompare(m_dimension_layer_id, other.m_dimension_layer_id))
    return false;

  return true;
}